

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

symbol * Symbol_find(char *key)

{
  s_x2node *psVar1;
  s_x2 *psVar2;
  uint uVar3;
  int iVar4;
  s_x2node **ppsVar5;
  
  psVar2 = x2a;
  if (x2a != (s_x2 *)0x0) {
    uVar3 = strhash(key);
    ppsVar5 = psVar2->ht + (psVar2->size - 1U & uVar3);
    while (psVar1 = *ppsVar5, psVar1 != (s_x2node *)0x0) {
      iVar4 = strcmp(psVar1->key,key);
      if (iVar4 == 0) {
        return psVar1->data;
      }
      ppsVar5 = &psVar1->next;
    }
  }
  return (symbol *)0x0;
}

Assistant:

struct symbol *Symbol_find(const char *key)
{
  unsigned h;
  x2node *np;

  if( x2a==0 ) return 0;
  h = strhash(key) & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}